

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O3

int mbhitm(monst *mtmp,obj *otmp)

{
  ushort uVar1;
  boolean bVar2;
  int extraout_EAX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int extraout_EAX_00;
  you *extraout_RAX;
  you *extraout_RAX_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  you *extraout_RAX_01;
  char *pcVar6;
  you *extraout_RAX_02;
  obj *poVar7;
  you *pyVar8;
  undefined7 extraout_var_02;
  int tmp;
  int tmp_1;
  int iVar9;
  
  if ((mtmp != &youmonst) && (mtmp->field_0x62 = mtmp->field_0x62 & 0xf7, mtmp->m_ap_type != '\0'))
  {
    seemimic(mtmp);
  }
  uVar1 = otmp->otyp;
  pyVar8 = (you *)(ulong)uVar1;
  if (0x1c9 < uVar1) {
    if (uVar1 == 0x1ca) goto LAB_001faa7b;
    if (uVar1 == 0x1cb) {
      if (mtmp == &youmonst) {
        if (zap_oseen != '\0') {
          discover_object(0x1cb,'\x01','\x01');
        }
        iVar3 = tele((char *)0x0);
        return iVar3;
      }
      if (((mtmp->field_0x63 & 0x10) == 0) ||
         (pcVar6 = in_rooms(level,mtmp->mx,mtmp->my,10), *pcVar6 == '\0')) {
        bVar2 = tele_restrict(mtmp);
        pyVar8 = (you *)CONCAT71(extraout_var_00,bVar2);
        if (bVar2 == '\0') {
          bVar2 = rloc(level,mtmp,'\0');
          return (int)CONCAT71(extraout_var_01,bVar2);
        }
      }
      else {
        pyVar8 = (you *)viz_array[mtmp->my];
        if ((pyVar8->urooms[(long)mtmp->mx + -0x24] & 2U) != 0) {
          pcVar6 = Monnam(mtmp);
          pline("%s resists the magic!",pcVar6);
          pyVar8 = extraout_RAX_00;
        }
        mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
        if (mtmp->m_ap_type != '\0') {
          seemimic(mtmp);
          return extraout_EAX;
        }
      }
    }
    goto LAB_001faf8b;
  }
  if (uVar1 == 0x1a1) {
LAB_001faa7b:
    bVar2 = cancel_monst(mtmp,otmp,'\0','\x01','\0');
    return (int)CONCAT71(extraout_var,bVar2);
  }
  if (uVar1 != 0x1c4) goto LAB_001faf8b;
  if (mtmp == &youmonst) {
    if (zap_oseen != '\0') {
      discover_object(0x1c4,'\x01','\x01');
    }
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')))) {
      uVar5 = mt_random();
      if (u.uac + 9 <= (int)(uVar5 % 0x14)) {
        pcVar6 = "The wand misses you.";
        goto LAB_001fab0b;
      }
      pline("The wand hits you!");
      uVar5 = 2;
      iVar3 = -2;
      do {
        uVar4 = mt_random();
        uVar5 = uVar5 + uVar4 % 0xc;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0);
      uVar4 = uVar5 + 1 >> 1;
      if (u.uprops[0x32].extrinsic == 0 && u.uprops[0x32].intrinsic == 0) {
        uVar4 = uVar5;
      }
      losehp(uVar4,"wand",0);
    }
    else {
      shieldeff(u.ux,u.uy);
      pcVar6 = "Boing!";
LAB_001fab0b:
      pline(pcVar6);
    }
    stop_occupation();
    nomul(0,(char *)0x0);
    pyVar8 = extraout_RAX_01;
  }
  else {
    bVar2 = resists_magm(mtmp);
    if (bVar2 == '\0') {
      uVar5 = mt_random();
      iVar3 = find_mac(mtmp);
      if ((int)(uVar5 % 0x14) < iVar3 + 9) {
        iVar3 = 2;
        iVar9 = -2;
        do {
          uVar5 = mt_random();
          iVar3 = iVar3 + uVar5 % 0xc;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 0);
        pcVar6 = exclam(iVar3);
        hit("wand",'\0',mtmp,pcVar6);
        resist(mtmp,otmp->oclass,iVar3,1);
      }
      else {
        miss("wand",mtmp);
      }
      pyVar8 = (you *)viz_array[mtmp->my];
      if (((pyVar8->urooms[(long)mtmp->mx + -0x24] & 2U) != 0) && (zap_oseen != '\0')) {
        discover_object(0x1c4,'\x01','\x01');
        pyVar8 = extraout_RAX_02;
      }
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
      pline("Boing!");
      pyVar8 = extraout_RAX;
    }
  }
  if ((mtmp->mhp < 1) || (pyVar8 = (you *)viz_array, (viz_array[bhitpos.y][bhitpos.x] & 2U) == 0))
  goto LAB_001faf8b;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001fade4;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fad7d;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fad74;
    }
    else {
LAB_001fad74:
      if (ublindf == (obj *)0x0) goto LAB_001fae39;
LAB_001fad7d:
      if (ublindf->oartifact != '\x1d') goto LAB_001fae39;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001fade4;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
LAB_001fade4:
      uVar5 = *(uint *)&mtmp->field_0x60;
      if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar5 & 0x280) == 0) goto LAB_001fae2c;
      }
      else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001fae2c:
        pyVar8 = &u;
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001faf8b;
      }
    }
  }
LAB_001fae39:
  if (((mtmp->data->mflags1 & 0x10000) == 0) &&
     ((poVar7 = which_armor(mtmp,4), poVar7 == (obj *)0x0 ||
      (poVar7 = which_armor(mtmp,4), poVar7->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fae91;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fae8c;
    }
    else {
LAB_001fae8c:
      if (ublindf != (obj *)0x0) {
LAB_001fae91:
        if (ublindf->oartifact == '\x1d') goto LAB_001faf24;
      }
      pyVar8 = (you *)(ulong)CONCAT31((int3)((u.uprops[0x19].extrinsic | u.uprops[0x19].intrinsic)
                                            >> 8),youmonst.data != mons + 0x32);
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic | u.uprops[0x19].intrinsic) != 0) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001faf8b;
    }
LAB_001faf24:
    if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001faf5f;
    uVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
    pyVar8 = (you *)(ulong)uVar5;
    if ((int)uVar5 < 0x41) goto LAB_001faf8b;
  }
  else {
LAB_001faf5f:
    pyVar8 = &u;
  }
  if ((u.uprops[0x42].intrinsic == 0) && (pyVar8 = &u, u.uprops[0x42].extrinsic == 0)) {
    bVar2 = match_warn_of_mon(mtmp);
    pyVar8 = (you *)CONCAT71(extraout_var_02,bVar2);
    if (bVar2 == '\0') {
      map_invisible(bhitpos.x,bhitpos.y);
      return extraout_EAX_00;
    }
  }
LAB_001faf8b:
  return (int)pyVar8;
}

Assistant:

static int mbhitm(struct monst *mtmp, struct obj *otmp)
{
	int tmp;

	boolean reveal_invis = FALSE;
	if (mtmp != &youmonst) {
		mtmp->msleeping = 0;
		if (mtmp->m_ap_type) seemimic(mtmp);
	}
	switch(otmp->otyp) {
	case WAN_STRIKING:
		reveal_invis = TRUE;
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_STRIKING);
			if (Antimagic) {
			    shieldeff(u.ux, u.uy);
			    pline("Boing!");
			} else if (rnd(20) < 10 + u.uac) {
			    pline("The wand hits you!");
			    tmp = dice(2,12);
			    if (Half_spell_damage) tmp = (tmp+1) / 2;
			    losehp(tmp, "wand", KILLED_BY_AN);
			} else pline("The wand misses you.");
			stop_occupation();
			nomul(0, NULL);
		} else if (resists_magm(mtmp)) {
			shieldeff(mtmp->mx, mtmp->my);
			pline("Boing!");
		} else if (rnd(20) < 10+find_mac(mtmp)) {
			tmp = dice(2,12);
			hit("wand", FALSE, mtmp, exclam(tmp));
			resist(mtmp, otmp->oclass, tmp, TELL);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		} else {
			miss("wand", mtmp);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		}
		break;
	case WAN_TELEPORTATION:
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_TELEPORTATION);
			tele(NULL);
		} else {
			/* for consistency with zap.c, don't identify */
			if (mtmp->ispriest &&
				*in_rooms(level, mtmp->mx, mtmp->my, TEMPLE)) {
			    if (cansee(mtmp->mx, mtmp->my))
				pline("%s resists the magic!", Monnam(mtmp));
			    mtmp->msleeping = 0;
			    if (mtmp->m_ap_type) seemimic(mtmp);
			} else if (!tele_restrict(mtmp))
			    rloc(level, mtmp, FALSE);
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, FALSE, TRUE, FALSE);
		break;
	}
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x,bhitpos.y)
							&& !canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}